

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O2

boolean jpeg_start_output(j_decompress_ptr cinfo,int scan_number)

{
  jpeg_error_mgr *pjVar1;
  int iVar2;
  boolean bVar3;
  
  iVar2 = cinfo->global_state;
  if ((iVar2 != 0xcc) && (iVar2 != 0xcf)) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x14;
    (pjVar1->msg_parm).i[0] = iVar2;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar2 = 1;
  if (1 < scan_number) {
    iVar2 = scan_number;
  }
  if ((cinfo->inputctl->eoi_reached != 0) && (cinfo->input_scan_number <= iVar2)) {
    iVar2 = cinfo->input_scan_number;
  }
  cinfo->output_scan_number = iVar2;
  bVar3 = output_pass_setup(cinfo);
  return bVar3;
}

Assistant:

GLOBAL(boolean)
jpeg_start_output(j_decompress_ptr cinfo, int scan_number)
{
  if (cinfo->global_state != DSTATE_BUFIMAGE &&
      cinfo->global_state != DSTATE_PRESCAN)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  /* Limit scan number to valid range */
  if (scan_number <= 0)
    scan_number = 1;
  if (cinfo->inputctl->eoi_reached && scan_number > cinfo->input_scan_number)
    scan_number = cinfo->input_scan_number;
  cinfo->output_scan_number = scan_number;
  /* Perform any dummy output passes, and set up for the real pass */
  return output_pass_setup(cinfo);
}